

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSense.c
# Opt level: O3

Abc_Obj_t * Abc_NtkSensitivityMiter_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNode)

{
  int *piVar1;
  void **ppvVar2;
  Abc_Obj_t *pAVar3;
  
  if (((ulong)pNode & 1) == 0) {
    pAVar3 = (Abc_Obj_t *)(pNode->field_6).pTemp;
    if (pAVar3 == (Abc_Obj_t *)0x0) {
      Abc_NtkSensitivityMiter_rec
                (pNtkNew,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]);
      Abc_NtkSensitivityMiter_rec
                (pNtkNew,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]]);
      piVar1 = (pNode->vFanins).pArray;
      ppvVar2 = pNode->pNtk->vObjs->pArray;
      pAVar3 = Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,
                          (Abc_Obj_t *)
                          ((ulong)(*(uint *)&pNode->field_0x14 >> 10 & 1) ^
                          *(ulong *)((long)ppvVar2[*piVar1] + 0x40)),
                          (Abc_Obj_t *)
                          ((ulong)(*(uint *)&pNode->field_0x14 >> 0xb & 1) ^
                          *(ulong *)((long)ppvVar2[piVar1[1]] + 0x40)));
      (pNode->field_6).pCopy = pAVar3;
    }
    return pAVar3;
  }
  __assert_fail("!Abc_ObjIsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSense.c"
                ,0x30,"Abc_Obj_t *Abc_NtkSensitivityMiter_rec(Abc_Ntk_t *, Abc_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Copies the topmost levels of the network.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Obj_t * Abc_NtkSensitivityMiter_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNode )
{
    assert( !Abc_ObjIsComplement(pNode) );
    if ( pNode->pCopy )
        return pNode->pCopy;
    Abc_NtkSensitivityMiter_rec( pNtkNew, Abc_ObjFanin0(pNode) );
    Abc_NtkSensitivityMiter_rec( pNtkNew, Abc_ObjFanin1(pNode) );
    return pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
}